

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<short>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  short sVar2;
  short *psVar3;
  _Optional_payload_base<short> local_2c;
  int local_28;
  Optional<short> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  local_28 = indent;
  opt.super__Optional_base<short,_true,_true>._M_payload.super__Optional_payload_base<short>._3_1_ =
       fixed;
  if (fixed) {
    sVar2 = Struct::GetField<short>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<short>(this,sVar2,&(fd->value).type,local_28);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      local_2c = (_Optional_payload_base<short>)
                 Table::GetOptional<short,short>(table,(fd->value).offset);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_2c);
      if (bVar1) {
        psVar3 = std::optional<short>::operator*((optional<short> *)&local_2c);
        PrintScalar<short>(this,*psVar3,&(fd->value).type,local_28);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      sVar2 = GetFieldDefault<short>(fd);
      sVar2 = Table::GetField<short>(table,field,sVar2);
      PrintScalar<short>(this,sVar2,&(fd->value).type,local_28);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }